

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O2

void Diligent::BasicFileSystem::GetPathComponents(String *Path,String *Directory,String *FileName)

{
  long lVar1;
  string asStack_48 [32];
  
  lVar1 = std::__cxx11::string::find_last_of((char *)Path,0x5ac3b1);
  if (Directory != (String *)0x0) {
    if (lVar1 == -1) {
      std::__cxx11::string::assign((char *)Directory);
      if (FileName == (String *)0x0) {
        return;
      }
      goto LAB_00476afc;
    }
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)Path);
    std::__cxx11::string::operator=((string *)Directory,asStack_48);
    std::__cxx11::string::~string(asStack_48);
  }
  if (FileName == (String *)0x0) {
    return;
  }
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)Path);
    std::__cxx11::string::operator=((string *)FileName,asStack_48);
    std::__cxx11::string::~string(asStack_48);
    return;
  }
LAB_00476afc:
  std::__cxx11::string::_M_assign((string *)FileName);
  return;
}

Assistant:

void BasicFileSystem::GetPathComponents(const String& Path,
                                        String*       Directory,
                                        String*       FileName)
{
    auto LastSlashPos = Path.find_last_of("/\\");
    if (Directory)
    {
        if (LastSlashPos != String::npos)
            *Directory = Path.substr(0, LastSlashPos);
        else
            *Directory = "";
    }

    if (FileName)
    {
        if (LastSlashPos != String::npos)
            *FileName = Path.substr(LastSlashPos + 1);
        else
            *FileName = Path;
    }
}